

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>_>
 __thiscall ninx::parser::Parser::parse_function_call(Parser *this)

{
  Keyword *this_00;
  _Tuple_impl<0UL,_ninx::parser::element::FunctionCall_*,_std::default_delete<ninx::parser::element::FunctionCall>_>
  _Var1;
  bool late_call;
  int iVar2;
  int iVar3;
  int iVar4;
  Token *pTVar5;
  FunctionCallArgument *this_01;
  string *psVar6;
  FunctionCall *this_02;
  ParserException *pPVar7;
  string *in_RSI;
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  arguments;
  __single_object *function_call;
  _Alloc_hider local_90;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  local_68;
  Keyword *local_48;
  _Alloc_hider local_40;
  _Head_base<0UL,_ninx::parser::element::FunctionCall_*,_false> local_38;
  
  psVar6 = in_RSI + 1;
  local_38._M_head_impl = (FunctionCall *)this;
  pTVar5 = TokenReader::get_token((TokenReader *)psVar6);
  if (pTVar5 == (Token *)0x0) {
    local_48 = (Keyword *)0x0;
  }
  else {
    local_48 = (Keyword *)
               __dynamic_cast(pTVar5,&lexer::token::Token::typeinfo,&lexer::token::Keyword::typeinfo
                              ,0);
  }
  local_68.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = TokenReader::check_limiter((TokenReader *)psVar6,'(');
  if (iVar2 == 1) {
    TokenReader::get_token((TokenReader *)psVar6);
    do {
      iVar2 = TokenReader::check_limiter((TokenReader *)psVar6,')');
      if (iVar2 != 0) break;
      parse_function_call_argument((Parser *)&local_90);
      std::
      vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>>
      ::
      emplace_back<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>
                ((vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>>
                  *)&local_68,
                 (unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                  *)&local_90);
      iVar3 = TokenReader::check_limiter((TokenReader *)psVar6,',');
      if (iVar3 == 1) {
        TokenReader::get_token((TokenReader *)psVar6);
      }
      else {
        iVar4 = TokenReader::check_limiter((TokenReader *)psVar6,')');
        if (iVar4 != 1) {
          pTVar5 = TokenReader::get_token((TokenReader *)psVar6);
          pPVar7 = (ParserException *)__cxa_allocate_exception(0x20);
          local_88._0_8_ = &local_78;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_88,"Another argument or end of arguments expected.","");
          exception::ParserException::ParserException(pPVar7,pTVar5,in_RSI,(string *)local_88);
          __cxa_throw(pPVar7,&exception::ParserException::typeinfo,
                      std::runtime_error::~runtime_error);
        }
      }
      if ((long *)local_90._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_90._M_p + 8))();
      }
    } while (iVar3 == 1);
    TokenReader::get_token((TokenReader *)psVar6);
    if (iVar2 == -1) {
      pPVar7 = (ParserException *)__cxa_allocate_exception(0x20);
      local_88._0_8_ = &local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_88,"Expected \')\' but EOF has been reached.","");
      exception::ParserException::ParserException(pPVar7,(Token *)0x0,in_RSI,(string *)local_88);
      __cxa_throw(pPVar7,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  iVar2 = TokenReader::check_limiter((TokenReader *)psVar6,'{');
  this_00 = local_48;
  if (iVar2 == 1) {
    parse_block((Parser *)&stack0xffffffffffffffc0);
    this_01 = (FunctionCallArgument *)operator_new(0x28);
    local_88._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_90._M_p = local_40._M_p;
    element::FunctionCallArgument::FunctionCallArgument
              (this_01,(unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_88,
               (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                *)&local_90);
    if ((long *)local_90._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_90._M_p + 8))();
    }
    local_90._M_p = (pointer)0x0;
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_88._0_8_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_88._0_8_);
    }
  }
  else {
    this_01 = (FunctionCallArgument *)0x0;
  }
  psVar6 = lexer::token::Keyword::get_keyword_abi_cxx11_(this_00);
  late_call = lexer::token::Keyword::is_late(this_00);
  this_02 = (FunctionCall *)operator_new(0x60);
  local_88._0_8_ =
       local_68.
       super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88._8_8_ =
       local_68.
       super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78._0_8_ =
       local_68.
       super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90._M_p = (pointer)this_01;
  element::FunctionCall::FunctionCall
            (this_02,psVar6,
             (vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
              *)local_88,
             (unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
              *)&local_90,late_call);
  _Var1.super__Head_base<0UL,_ninx::parser::element::FunctionCall_*,_false>._M_head_impl =
       (_Head_base<0UL,_ninx::parser::element::FunctionCall_*,_false>)
       (_Head_base<0UL,_ninx::parser::element::FunctionCall_*,_false>)local_38._M_head_impl;
  *(FunctionCall **)local_38._M_head_impl = this_02;
  if ((FunctionCallArgument *)local_90._M_p != (FunctionCallArgument *)0x0) {
    (**(code **)(*(long *)local_90._M_p + 8))();
  }
  local_90._M_p = (pointer)0x0;
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
             *)local_88);
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ::~vector(&local_68);
  return (unique_ptr<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>_>
          )(FunctionCall *)
           _Var1.super__Head_base<0UL,_ninx::parser::element::FunctionCall_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<FunctionCall> ninx::parser::Parser::parse_function_call() {
    auto token{reader.get_token()};
    auto call_token{dynamic_cast<ninx::lexer::token::Keyword *>(token)};

    std::vector<std::unique_ptr<FunctionCallArgument>> arguments;

    // Parse optional call parameters
    if (reader.check_limiter('(') == 1) {
        reader.get_token();

        // Cycle until a closing parenthesis is found or EOF is reached
        int result;
        while ((result = reader.check_limiter(')')) == 0) {
            auto argument{parse_function_call_argument()};

            arguments.push_back(std::move(argument));

            if (reader.check_limiter(',') == 1) {
                // Skip the period limiter
                reader.get_token();
            } else if (reader.check_limiter(')') == 1) {
                break;
            } else {
                auto error_token{reader.get_token()};
                throw ParserException(error_token, this->origin, "Another argument or end of arguments expected.");
            }
        }
        reader.get_token(); // Skip the closing parenthesis
        if (result == -1) {
            throw ParserException(nullptr, this->origin, "Expected ')' but EOF has been reached.");
        }
    }

    std::unique_ptr<FunctionCallArgument> outer_argument{nullptr};

    // Check if there is a block argument at the end
    if (reader.check_limiter('{') == 1) {
        auto value{parse_block()};

        outer_argument = std::make_unique<FunctionCallArgument>(nullptr, std::move(value));
    }

    auto function_call = std::make_unique<FunctionCall>(call_token->get_keyword(), std::move(arguments),
                                                        std::move(outer_argument), call_token->is_late());

    return function_call;
}